

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O2

TIntermTyped * __thiscall
glslang::HlslParseContext::handleDotDereference
          (HlslParseContext *this,TSourceLoc *loc,TIntermTyped *base,TString *field)

{
  pointer pTVar1;
  TString name;
  TString name_00;
  TString name_01;
  TString structName;
  TString structName_00;
  TString structName_01;
  bool bVar2;
  int iVar3;
  uint uVar4;
  TBasicType TVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar7;
  undefined4 extraout_var_01;
  TPoolAllocator *pTVar8;
  undefined4 extraout_var_02;
  TIntermTyped *pTVar9;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  TTypeList *pTVar10;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *__lhs;
  TIntermConstantUnion *pTVar11;
  TIntermTyped *pTVar12;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  _func_int **pp_Var13;
  undefined4 extraout_var_12;
  char *pcVar14;
  char *pcVar15;
  TOperator op;
  TType *pTVar16;
  HlslParseContext *this_00;
  TIntermediate *pTVar17;
  long lVar18;
  undefined4 uStack_29c;
  undefined8 local_290;
  TSwizzleSelectors<int> selectors;
  TIntermTyped *base_local;
  TType type;
  TType vectorType;
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_120 [40];
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_f8 [40];
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_d0 [40];
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_a8 [40];
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_80 [40];
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_58 [40];
  
  base_local = base;
  variableCheck(this,&base_local);
  pTVar9 = base_local;
  iVar3 = (*(base_local->super_TIntermNode)._vptr_TIntermNode[0x2a])(base_local);
  if ((char)iVar3 != '\0') {
    pp_Var13 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar15 = "cannot apply to an array:";
    pcVar14 = ".";
    type._8_8_ = (field->_M_dataplus)._M_p;
LAB_0031215b:
    (*pp_Var13[0x2d])(this,loc,pcVar15,pcVar14,type._8_8_);
    return pTVar9;
  }
  iVar3 = (*(pTVar9->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar9);
  iVar3 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x38))
                    ((long *)CONCAT44(extraout_var,iVar3));
  pp_Var13 = (pTVar9->super_TIntermNode)._vptr_TIntermNode;
  if (iVar3 == 0xe) {
    iVar3 = (*pp_Var13[0x1e])();
    lVar7 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0x40))
                      ((long *)CONCAT44(extraout_var_00,iVar3));
    if (((*(byte *)(lVar7 + 2) & 0x28) == 0) && (bVar2 = std::operator==(field,"mips"), bVar2)) {
      type.qualifier.semanticName = *(char **)&loc->column;
      type._vptr_TType = (_func_int **)loc->name;
      type._8_4_ = loc->string;
      type._12_4_ = loc->line;
      type.qualifier._8_8_ = 0;
      std::
      vector<glslang::HlslParseContext::tMipsOperatorData,_glslang::pool_allocator<glslang::HlslParseContext::tMipsOperatorData>_>
      ::emplace_back<glslang::HlslParseContext::tMipsOperatorData>
                (&(this->mipsOperatorMipArg).
                  super_vector<glslang::HlslParseContext::tMipsOperatorData,_glslang::pool_allocator<glslang::HlslParseContext::tMipsOperatorData>_>
                 ,(tMipsOperatorData *)&type);
      return pTVar9;
    }
    bVar2 = std::operator==(field,"mips");
    if (bVar2) {
      iVar3 = (*(pTVar9->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar9);
      vectorType._vptr_TType = (_func_int **)GetThreadPoolAllocator();
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      basic_string<glslang::std::allocator<char>>(local_58,"",(pool_allocator<char> *)&vectorType);
      pTVar8 = GetThreadPoolAllocator();
      selectors.size_ = (int)pTVar8;
      selectors.components[0] = (int)((ulong)pTVar8 >> 0x20);
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      basic_string<glslang::std::allocator<char>>(local_80,"",(pool_allocator<char> *)&selectors);
      uStack_29c = (undefined4)((ulong)local_80 >> 0x20);
      name._M_dataplus._M_p._0_4_ = (int)local_80;
      name._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)local_58;
      name._M_dataplus._M_p._4_4_ = uStack_29c;
      name._M_string_length = (size_type)loc;
      name.field_2._M_allocated_capacity = local_290;
      name.field_2._8_4_ = selectors.size_;
      name.field_2._12_4_ = selectors.components[0];
      structName._4_28_ = stack0xfffffffffffffd84;
      structName._M_dataplus.super_allocator_type.allocator._0_4_ = selectors.components[1];
      structName.field_2._8_8_ = base_local;
      TType::getCompleteString
                ((TString *)&type,(TType *)CONCAT44(extraout_var_01,iVar3),false,true,true,true,name
                 ,structName);
      pp_Var13 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar15 = "unexpected texture type for .mips[][] operator:";
      pcVar14 = (char *)type._8_8_;
      type._8_8_ = "";
    }
    else {
      pcVar14 = (field->_M_dataplus)._M_p;
      iVar3 = (*(pTVar9->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar9);
      vectorType._vptr_TType = (_func_int **)GetThreadPoolAllocator();
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      basic_string<glslang::std::allocator<char>>(local_a8,"",(pool_allocator<char> *)&vectorType);
      pTVar8 = GetThreadPoolAllocator();
      selectors.size_ = (int)pTVar8;
      selectors.components[0] = (int)((ulong)pTVar8 >> 0x20);
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      basic_string<glslang::std::allocator<char>>(local_d0,"",(pool_allocator<char> *)&selectors);
      uStack_29c = (undefined4)((ulong)local_d0 >> 0x20);
      name_00._M_dataplus._M_p._0_4_ = (int)local_d0;
      name_00._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)local_a8;
      name_00._M_dataplus._M_p._4_4_ = uStack_29c;
      name_00._M_string_length = (size_type)loc;
      name_00.field_2._M_allocated_capacity = (size_type)pcVar14;
      name_00.field_2._8_4_ = selectors.size_;
      name_00.field_2._12_4_ = selectors.components[0];
      structName_00._4_28_ = stack0xfffffffffffffd84;
      structName_00._M_dataplus.super_allocator_type.allocator._0_4_ = selectors.components[1];
      structName_00.field_2._8_8_ = base_local;
      TType::getCompleteString
                ((TString *)&type,(TType *)CONCAT44(extraout_var_02,iVar3),false,true,true,true,
                 name_00,structName_00);
      pp_Var13 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar15 = "unexpected operator on texture type:";
    }
    goto LAB_0031215b;
  }
  iVar3 = (*pp_Var13[0x2b])(pTVar9);
  if (((char)iVar3 == '\0') &&
     (iVar3 = (*(pTVar9->super_TIntermNode)._vptr_TIntermNode[0x2c])(pTVar9), (char)iVar3 == '\0'))
  {
    iVar3 = (*(pTVar9->super_TIntermNode)._vptr_TIntermNode[0x29])(pTVar9);
    if ((char)iVar3 == '\0') {
      iVar3 = (*(pTVar9->super_TIntermNode)._vptr_TIntermNode[0x20])(pTVar9);
      if ((iVar3 == 0xf) ||
         (iVar3 = (*(pTVar9->super_TIntermNode)._vptr_TIntermNode[0x20])(pTVar9), iVar3 == 0x10)) {
        iVar3 = (*(pTVar9->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar9);
        pTVar10 = TType::getStruct((TType *)CONCAT44(extraout_var_05,iVar3));
        lVar18 = 0;
        for (lVar7 = 0;
            pTVar1 = (pTVar10->
                     super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                     super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                     ._M_impl.super__Vector_impl_data._M_start,
            lVar7 < (int)((ulong)((long)(pTVar10->
                                        super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                        ).
                                        super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar1)
                         >> 5); lVar7 = lVar7 + 1) {
          __lhs = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                  (**(code **)(**(long **)((long)&pTVar1->type + lVar18) + 0x30))();
          bVar2 = std::operator==(__lhs,field);
          if (bVar2) {
            iVar3 = (*(pTVar9->super_TIntermNode)._vptr_TIntermNode[0xc])(pTVar9);
            iVar6 = (int)lVar7;
            if ((CONCAT44(extraout_var_07,iVar3) != 0) && (bVar2 = wasFlattened(this,pTVar9), bVar2)
               ) {
              pTVar9 = flattenAccess(this,pTVar9,iVar6);
              return pTVar9;
            }
            iVar3 = (*(pTVar9->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar9);
            lVar7 = (**(code **)(*(long *)CONCAT44(extraout_var_08,iVar3) + 0x58))
                              ((long *)CONCAT44(extraout_var_08,iVar3));
            pTVar17 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
            if ((*(uint *)(lVar7 + 8) & 0x7f) == 2) {
              pTVar9 = TIntermediate::foldDereference(pTVar17,pTVar9,iVar6,loc);
              return pTVar9;
            }
            pTVar11 = TIntermediate::addConstantUnion(pTVar17,iVar6,loc,false);
            pTVar9 = TIntermediate::addIndex
                               ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                                EOpIndexDirectStruct,pTVar9,&pTVar11->super_TIntermTyped,loc);
            pTVar16 = *(TType **)
                       ((long)&((pTVar10->
                                super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                ).
                                super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                ._M_impl.super__Vector_impl_data._M_start)->type + lVar18);
            pp_Var13 = (pTVar9->super_TIntermNode)._vptr_TIntermNode;
            goto LAB_0031299b;
          }
          lVar18 = lVar18 + 0x20;
        }
        pcVar14 = (field->_M_dataplus)._M_p;
        pp_Var13 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
        pcVar15 = "no such field in structure";
        type._8_8_ = "";
      }
      else {
        pcVar14 = (field->_M_dataplus)._M_p;
        iVar3 = (*(pTVar9->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar9);
        vectorType._vptr_TType = (_func_int **)GetThreadPoolAllocator();
        std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
        basic_string<glslang::std::allocator<char>>(local_f8,"",(pool_allocator<char> *)&vectorType)
        ;
        pTVar8 = GetThreadPoolAllocator();
        selectors.size_ = (int)pTVar8;
        selectors.components[0] = (int)((ulong)pTVar8 >> 0x20);
        std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
        basic_string<glslang::std::allocator<char>>(local_120,"",(pool_allocator<char> *)&selectors)
        ;
        uStack_29c = (undefined4)((ulong)local_120 >> 0x20);
        name_01._M_dataplus._M_p._0_4_ = (int)local_120;
        name_01._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)local_f8;
        name_01._M_dataplus._M_p._4_4_ = uStack_29c;
        name_01._M_string_length = (size_type)loc;
        name_01.field_2._M_allocated_capacity = (size_type)pcVar14;
        name_01.field_2._8_4_ = selectors.size_;
        name_01.field_2._12_4_ = selectors.components[0];
        structName_01._4_28_ = stack0xfffffffffffffd84;
        structName_01._M_dataplus.super_allocator_type.allocator._0_4_ = selectors.components[1];
        structName_01.field_2._8_8_ = base_local;
        TType::getCompleteString
                  ((TString *)&type,(TType *)CONCAT44(extraout_var_10,iVar3),false,true,true,true,
                   name_01,structName_01);
        pp_Var13 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
        pcVar15 = "does not apply to this type:";
      }
      goto LAB_0031215b;
    }
    selectors.size_ = 0;
    iVar3 = (*(pTVar9->super_TIntermNode)._vptr_TIntermNode[0x27])(pTVar9);
    iVar6 = (*(pTVar9->super_TIntermNode)._vptr_TIntermNode[0x28])(pTVar9);
    bVar2 = parseMatrixSwizzleSelector
                      (this,loc,field,iVar3,iVar6,
                       (TSwizzleSelectors<glslang::TMatrixSelector> *)&selectors);
    if (!bVar2) {
      return pTVar9;
    }
    pp_Var13 = (pTVar9->super_TIntermNode)._vptr_TIntermNode;
    if (selectors.size_ == 1) {
      iVar3 = (*pp_Var13[0x1e])(pTVar9);
      lVar7 = (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar3) + 0x58))
                        ((long *)CONCAT44(extraout_var_03,iVar3));
      pTVar17 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      if ((*(ulong *)(lVar7 + 8) & 0x10000007f) != 2) {
        pTVar11 = TIntermediate::addConstantUnion(pTVar17,selectors.components[0],loc,false);
        pTVar12 = TIntermediate::addIndex
                            (pTVar17,EOpIndexDirect,pTVar9,&pTVar11->super_TIntermTyped,loc);
        iVar3 = (*(pTVar9->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar9);
        TType::TType(&type,(TType *)CONCAT44(extraout_var_11,iVar3),0,false);
        (*(pTVar12->super_TIntermNode)._vptr_TIntermNode[0x1d])(pTVar12,&type);
        pTVar17 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        pTVar11 = TIntermediate::addConstantUnion(pTVar17,selectors.components[1],loc,false);
        pTVar9 = TIntermediate::addIndex
                           (pTVar17,EOpIndexDirect,pTVar12,&pTVar11->super_TIntermTyped,loc);
        pTVar16 = &vectorType;
        TType::TType(pTVar16,&type,0,false);
        pp_Var13 = (pTVar9->super_TIntermNode)._vptr_TIntermNode;
LAB_0031299b:
        (*pp_Var13[0x1d])(pTVar9,pTVar16);
        return pTVar9;
      }
      pTVar9 = TIntermediate::foldDereference(pTVar17,pTVar9,selectors.components[0],loc);
      pTVar17 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      iVar3 = selectors.components[1];
LAB_00312815:
      pTVar9 = TIntermediate::foldDereference(pTVar17,pTVar9,iVar3,loc);
      return pTVar9;
    }
    this_00 = (HlslParseContext *)pTVar9;
    iVar3 = (*pp_Var13[0x28])();
    iVar3 = getMatrixComponentsColumn
                      (this_00,iVar3,(TSwizzleSelectors<glslang::TMatrixSelector> *)&selectors);
    if (-1 < iVar3) {
      iVar6 = (*(pTVar9->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar9);
      lVar7 = (**(code **)(*(long *)CONCAT44(extraout_var_09,iVar6) + 0x58))
                        ((long *)CONCAT44(extraout_var_09,iVar6));
      pTVar17 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      if ((*(ulong *)(lVar7 + 8) & 0x10000007f) != 2) {
        pTVar11 = TIntermediate::addConstantUnion(pTVar17,iVar3,loc,false);
        pTVar12 = TIntermediate::addIndex
                            (pTVar17,EOpIndexDirect,pTVar9,&pTVar11->super_TIntermTyped,loc);
        iVar3 = (*(pTVar9->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar9);
        TType::TType(&type,(TType *)CONCAT44(extraout_var_12,iVar3),0,false);
        goto LAB_00312720;
      }
      goto LAB_00312815;
    }
    pTVar12 = TIntermediate::addSwizzle<glslang::TMatrixSelector>
                        ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                         (TSwizzleSelectors<glslang::TMatrixSelector> *)&selectors,loc);
    pTVar17 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    op = EOpMatrixSwizzle;
  }
  else {
    selectors.size_ = 0;
    uVar4 = (*(pTVar9->super_TIntermNode)._vptr_TIntermNode[0x26])(pTVar9);
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x44])
              (this,loc,field,(ulong)uVar4);
    iVar3 = (*(pTVar9->super_TIntermNode)._vptr_TIntermNode[0x2c])(pTVar9);
    if ((char)iVar3 != '\0') {
      if (selectors.size_ == 1) {
        return pTVar9;
      }
      TVar5 = (*(pTVar9->super_TIntermNode)._vptr_TIntermNode[0x20])(pTVar9);
      pTVar16 = &type;
      TType::TType(pTVar16,TVar5,EvqTemporary,selectors.size_,0,0,false);
LAB_0031248a:
      pTVar9 = addConstructor(this,loc,pTVar9,pTVar16);
      return pTVar9;
    }
    iVar3 = (*(pTVar9->super_TIntermNode)._vptr_TIntermNode[0x26])(pTVar9);
    if ((iVar3 == 1) && (1 < selectors.size_)) {
      TVar5 = (*(pTVar9->super_TIntermNode)._vptr_TIntermNode[0x20])(pTVar9);
      TType::TType(&type,TVar5,EvqTemporary,1,0,0,false);
      TVar5 = (*(pTVar9->super_TIntermNode)._vptr_TIntermNode[0x20])(pTVar9);
      pTVar16 = &vectorType;
      TType::TType(pTVar16,TVar5,EvqTemporary,selectors.size_,0,0,false);
      pTVar9 = addConstructor(this,loc,pTVar9,&type);
      goto LAB_0031248a;
    }
    iVar3 = (*(pTVar9->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar9);
    lVar7 = (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar3) + 0x58))
                      ((long *)CONCAT44(extraout_var_04,iVar3));
    if ((*(ulong *)(lVar7 + 8) & 0x10000007f) == 2) {
      pTVar9 = TIntermediate::foldSwizzle
                         ((this->super_TParseContextBase).super_TParseVersions.intermediate,pTVar9,
                          &selectors,loc);
      return pTVar9;
    }
    pTVar17 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    if (selectors.size_ == 1) {
      pTVar11 = TIntermediate::addConstantUnion(pTVar17,selectors.components[0],loc,false);
      pTVar12 = TIntermediate::addIndex
                          ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                           EOpIndexDirect,pTVar9,&pTVar11->super_TIntermTyped,loc);
      TVar5 = (*(pTVar9->super_TIntermNode)._vptr_TIntermNode[0x20])(pTVar9);
      TType::TType(&type,TVar5,EvqTemporary,1,0,0,false);
      goto LAB_00312720;
    }
    pTVar12 = TIntermediate::addSwizzle<int>(pTVar17,&selectors,loc);
    pTVar17 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    op = EOpVectorSwizzle;
  }
  pTVar12 = TIntermediate::addIndex(pTVar17,op,pTVar9,pTVar12,loc);
  TVar5 = (*(pTVar9->super_TIntermNode)._vptr_TIntermNode[0x20])(pTVar9);
  iVar3 = (*(pTVar9->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar9);
  lVar7 = (**(code **)(*(long *)CONCAT44(extraout_var_06,iVar3) + 0x58))
                    ((long *)CONCAT44(extraout_var_06,iVar3));
  TType::TType(&type,TVar5,EvqTemporary,*(uint *)(lVar7 + 8) >> 0x19 & 7,selectors.size_,0,0,false);
LAB_00312720:
  (*(pTVar12->super_TIntermNode)._vptr_TIntermNode[0x1d])(pTVar12,&type);
  return pTVar12;
}

Assistant:

TIntermTyped* HlslParseContext::handleDotDereference(const TSourceLoc& loc, TIntermTyped* base, const TString& field)
{
    variableCheck(base);

    if (base->isArray()) {
        error(loc, "cannot apply to an array:", ".", field.c_str());
        return base;
    }

    TIntermTyped* result = base;

    if (base->getType().getBasicType() == EbtSampler) {
        // Handle .mips[mipid][pos] operation on textures
        const TSampler& sampler = base->getType().getSampler();
        if (sampler.isTexture() && field == "mips") {
            // Push a null to signify that we expect a mip level under operator[] next.
            mipsOperatorMipArg.push_back(tMipsOperatorData(loc, nullptr));
            // Keep 'result' pointing to 'base', since we expect an operator[] to go by next.
        } else {
            if (field == "mips")
                error(loc, "unexpected texture type for .mips[][] operator:",
                      base->getType().getCompleteString().c_str(), "");
            else
                error(loc, "unexpected operator on texture type:", field.c_str(),
                      base->getType().getCompleteString().c_str());
        }
    } else if (base->isVector() || base->isScalar()) {
        TSwizzleSelectors<TVectorSelector> selectors;
        parseSwizzleSelector(loc, field, base->getVectorSize(), selectors);

        if (base->isScalar()) {
            if (selectors.size() == 1)
                return result;
            else {
                TType type(base->getBasicType(), EvqTemporary, selectors.size());
                return addConstructor(loc, base, type);
            }
        }
        // Use EOpIndexDirect (below) with vec1.x so that it remains l-value (Test/hlsl.swizzle.vec1.comp)
        if (base->getVectorSize() == 1 && selectors.size() > 1) {
            TType scalarType(base->getBasicType(), EvqTemporary, 1);
            TType vectorType(base->getBasicType(), EvqTemporary, selectors.size());
            return addConstructor(loc, addConstructor(loc, base, scalarType), vectorType);
        }

        if (base->getType().getQualifier().isFrontEndConstant())
            result = intermediate.foldSwizzle(base, selectors, loc);
        else {
            if (selectors.size() == 1) {
                TIntermTyped* index = intermediate.addConstantUnion(selectors[0], loc);
                result = intermediate.addIndex(EOpIndexDirect, base, index, loc);
                result->setType(TType(base->getBasicType(), EvqTemporary));
            } else {
                TIntermTyped* index = intermediate.addSwizzle(selectors, loc);
                result = intermediate.addIndex(EOpVectorSwizzle, base, index, loc);
                result->setType(TType(base->getBasicType(), EvqTemporary, base->getType().getQualifier().precision,
                                selectors.size()));
            }
        }
    } else if (base->isMatrix()) {
        TSwizzleSelectors<TMatrixSelector> selectors;
        if (! parseMatrixSwizzleSelector(loc, field, base->getMatrixCols(), base->getMatrixRows(), selectors))
            return result;

        if (selectors.size() == 1) {
            // Representable by m[c][r]
            if (base->getType().getQualifier().isFrontEndConstant()) {
                result = intermediate.foldDereference(base, selectors[0].coord1, loc);
                result = intermediate.foldDereference(result, selectors[0].coord2, loc);
            } else {
                result = intermediate.addIndex(EOpIndexDirect, base,
                                               intermediate.addConstantUnion(selectors[0].coord1, loc),
                                               loc);
                TType dereferencedCol(base->getType(), 0);
                result->setType(dereferencedCol);
                result = intermediate.addIndex(EOpIndexDirect, result,
                                               intermediate.addConstantUnion(selectors[0].coord2, loc),
                                               loc);
                TType dereferenced(dereferencedCol, 0);
                result->setType(dereferenced);
            }
        } else {
            int column = getMatrixComponentsColumn(base->getMatrixRows(), selectors);
            if (column >= 0) {
                // Representable by m[c]
                if (base->getType().getQualifier().isFrontEndConstant())
                    result = intermediate.foldDereference(base, column, loc);
                else {
                    result = intermediate.addIndex(EOpIndexDirect, base, intermediate.addConstantUnion(column, loc),
                                                   loc);
                    TType dereferenced(base->getType(), 0);
                    result->setType(dereferenced);
                }
            } else {
                // general case, not a column, not a single component
                TIntermTyped* index = intermediate.addSwizzle(selectors, loc);
                result = intermediate.addIndex(EOpMatrixSwizzle, base, index, loc);
                result->setType(TType(base->getBasicType(), EvqTemporary, base->getType().getQualifier().precision,
                                      selectors.size()));
           }
        }
    } else if (base->getBasicType() == EbtStruct || base->getBasicType() == EbtBlock) {
        const TTypeList* fields = base->getType().getStruct();
        bool fieldFound = false;
        int member;
        for (member = 0; member < (int)fields->size(); ++member) {
            if ((*fields)[member].type->getFieldName() == field) {
                fieldFound = true;
                break;
            }
        }
        if (fieldFound) {
            if (base->getAsSymbolNode() && wasFlattened(base)) {
                result = flattenAccess(base, member);
            } else {
                if (base->getType().getQualifier().storage == EvqConst)
                    result = intermediate.foldDereference(base, member, loc);
                else {
                    TIntermTyped* index = intermediate.addConstantUnion(member, loc);
                    result = intermediate.addIndex(EOpIndexDirectStruct, base, index, loc);
                    result->setType(*(*fields)[member].type);
                }
            }
        } else
            error(loc, "no such field in structure", field.c_str(), "");
    } else
        error(loc, "does not apply to this type:", field.c_str(), base->getType().getCompleteString().c_str());

    return result;
}